

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O3

_Bool pi_template_if_set(pi_template_generator_t *ptg_context)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  _Bool _Var4;
  
  uVar2 = (ulong)ptg_context->if_stack_top;
  if ((long)uVar2 < 1) {
    _Var4 = true;
  }
  else if (ptg_context->if_stack[0] == true) {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (uVar2 - 1 == lVar3) break;
      lVar1 = lVar3 + 1;
    } while (ptg_context->if_stack[lVar3 + 1] != false);
    _Var4 = uVar2 <= lVar3 + 1U;
  }
  else {
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool pi_template_if_set(pi_template_generator_t *ptg_context) {
    for (int i = 0; i < ptg_context->if_stack_top; i++) {
        if (!ptg_context->if_stack[i]) {
            return false;
        }
    }
    return true;
}